

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef __thiscall llvm::ARM::getDefaultCPU(ARM *this,StringRef Arch)

{
  ArchKind AVar1;
  StringRef SVar2;
  undefined1 local_88 [8];
  CpuNames<llvm::ARM::ArchKind> CPU;
  CpuNames<llvm::ARM::ArchKind> *__end1;
  CpuNames<llvm::ARM::ArchKind> *__begin1;
  CpuNames<llvm::ARM::ArchKind> (*__range1) [84];
  ArchKind AK;
  StringRef Arch_local;
  
  Arch_local.Data = Arch.Data;
  SVar2.Length = (size_t)Arch_local.Data;
  SVar2.Data = (char *)this;
  AVar1 = parseArch(SVar2);
  if (AVar1 == INVALID) {
    memset(&Arch_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&Arch_local.Length);
  }
  else {
    CPU._24_8_ = (anonymous_namespace)::AArch64ARCHNames;
    for (__end1 = (CpuNames<llvm::ARM::ArchKind> *)&(anonymous_namespace)::CPUNames;
        __end1 != (CpuNames<llvm::ARM::ArchKind> *)(anonymous_namespace)::AArch64ARCHNames;
        __end1 = __end1 + 1) {
      local_88 = (undefined1  [8])__end1->NameCStr;
      CPU.NameCStr = (char *)__end1->NameLength;
      CPU.NameLength._0_4_ = __end1->ArchID;
      CPU.NameLength._4_1_ = __end1->Default;
      CPU.NameLength._5_3_ = *(undefined3 *)&__end1->field_0x15;
      CPU.ArchID = __end1->DefaultExtensions;
      CPU.Default = (bool)__end1->field_0x1c;
      CPU._21_3_ = *(undefined3 *)&__end1->field_0x1d;
      if (((undefined4)CPU.NameLength == AVar1) && ((CPU.NameLength & 0x100000000) != 0)) {
        SVar2 = anon_unknown.dwarf_1c31ec::CpuNames<llvm::ARM::ArchKind>::getName
                          ((CpuNames<llvm::ARM::ArchKind> *)local_88);
        return SVar2;
      }
    }
    strlen("generic");
  }
  return stack0xffffffffffffffd8;
}

Assistant:

StringRef llvm::ARM::getDefaultCPU(StringRef Arch) {
  ArchKind AK = parseArch(Arch);
  if (AK == ARM::ArchKind::INVALID)
    return StringRef();

  // Look for multiple AKs to find the default for pair AK+Name.
  for (const auto CPU : CPUNames) {
    if (CPU.ArchID == AK && CPU.Default)
      return CPU.getName();
  }

  // If we can't find a default then target the architecture instead
  return "generic";
}